

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::backtrackToGlobal(HighsDomain *this)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  Reason RVar4;
  reference pvVar5;
  pointer pHVar6;
  reference pvVar7;
  reference pvVar8;
  HighsDomain *in_RDI;
  HighsInt i;
  HighsInt numreason;
  HighsInt prevpos;
  double prevbound;
  Reason old_reason;
  bool old_infeasible;
  HighsInt k;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar9;
  Reason in_stack_ffffffffffffff80;
  int local_60;
  int local_c;
  
  sVar3 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                    (&in_RDI->domchgstack_);
  local_60 = (int)sVar3;
  bVar2 = in_RDI->infeasible_;
  if (((in_RDI->infeasible_ & 1U) != 0) &&
     (iVar9 = in_RDI->infeasible_pos,
     sVar3 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                       (&in_RDI->domchgstack_), iVar9 == (int)sVar3)) {
    in_RDI->infeasible_ = false;
    RVar4 = Reason::unspecified();
    in_RDI->infeasible_reason = RVar4;
  }
  while (local_c = local_60 + -1, -1 < local_c) {
    pvVar5 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[](&in_RDI->prevboundval_,(long)local_c);
    dVar1 = pvVar5->first;
    pvVar5 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[](&in_RDI->prevboundval_,(long)local_c);
    iVar9 = pvVar5->second;
    pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5c89bd);
    in_stack_ffffffffffffff80 = (Reason)&pHVar6->field_0x68b0;
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_c);
    HighsDebugSol::boundChangeRemoved((HighsDebugSol *)in_stack_ffffffffffffff80,in_RDI,pvVar7);
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_c);
    if (pvVar7->boundtype == kLower) {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (&in_RDI->domchgstack_,(long)local_c);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->colLowerPos_,(long)pvVar7->column);
      *pvVar8 = iVar9;
      in_stack_ffffffffffffff7c = iVar9;
    }
    else {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (&in_RDI->domchgstack_,(long)local_c);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->colUpperPos_,(long)pvVar7->column);
      *pvVar8 = iVar9;
    }
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_c);
    if ((dVar1 != pvVar7->boundval) || (NAN(dVar1) || NAN(pvVar7->boundval))) {
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                (&in_RDI->domchgstack_,(long)local_c);
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                (&in_RDI->domchgstack_,(long)local_c);
      doChangeBound((HighsDomain *)in_stack_ffffffffffffff80,
                    (HighsDomainChange *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    local_60 = local_c;
    if (((in_RDI->infeasible_ & 1U) != 0) && (in_RDI->infeasible_pos == local_c)) {
      in_RDI->infeasible_ = false;
      RVar4 = Reason::unspecified();
      in_RDI->infeasible_reason = RVar4;
    }
  }
  if ((bVar2 & 1U) != 0) {
    markPropagateCut((HighsDomain *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff80);
    RVar4 = Reason::unspecified();
    in_RDI->infeasible_reason = RVar4;
    in_RDI->infeasible_ = false;
  }
  sVar3 = std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::size
                    (&in_RDI->domchgreason_);
  for (; local_60 < (int)sVar3; local_60 = local_60 + 1) {
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator[]
              (&in_RDI->domchgreason_,(long)local_60);
    markPropagateCut((HighsDomain *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff80);
  }
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::clear
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x5c8c35);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x5c8c43);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::clear
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)0x5c8c51);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5c8c62);
  return;
}

Assistant:

void HighsDomain::backtrackToGlobal() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }

  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    if (prevbound != domchgstack_[k].boundval) {
      // change back to global bound
      doChangeBound(
          {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});
    }

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  domchgstack_.clear();
  prevboundval_.clear();
  domchgreason_.clear();
  branchPos_.clear();
}